

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell::createTest
          (TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell *this)

{
  Utest *this_00;
  TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x1b1);
  TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test::
  TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test
            ((TEST_MockComparatorCopierTest_customTypeOutputParameterTraced_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterTraced)
{
    MyTypeForTesting actualObject(676789);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);
    mock().tracing(true);

    mock().actualCall("someFunc").withOutputParameterOfType("MyTypeForTesting", "someParameter", &actualObject);

    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc MyTypeForTesting someParameter:", mock().getTraceOutput());

    mock().removeAllComparatorsAndCopiers();
}